

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
          (BinaryWriterSpec *this,Stream *json_stream,
          WriteBinarySpecStreamFactory *module_stream_factory,string_view source_filename,
          string_view module_filename_noext,WriteBinaryOptions *options)

{
  allocator<char> local_3a;
  allocator<char> local_39;
  WriteBinaryOptions *local_38;
  WriteBinaryOptions *options_local;
  WriteBinarySpecStreamFactory *module_stream_factory_local;
  Stream *json_stream_local;
  BinaryWriterSpec *this_local;
  string_view source_filename_local;
  
  source_filename_local._M_len = (size_t)source_filename._M_str;
  this_local = (BinaryWriterSpec *)source_filename._M_len;
  this->script_ = (Script *)0x0;
  this->json_stream_ = json_stream;
  local_38 = options;
  options_local = (WriteBinaryOptions *)module_stream_factory;
  module_stream_factory_local = (WriteBinarySpecStreamFactory *)json_stream;
  json_stream_local = (Stream *)this;
  std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::function
            (&this->module_stream_factory_,module_stream_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->source_filename_,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->module_filename_noext_,&module_filename_noext,&local_3a);
  std::allocator<char>::~allocator(&local_3a);
  this->options_ = local_38;
  Result::Result(&this->result_,Ok);
  this->num_modules_ = 0;
  return;
}

Assistant:

BinaryWriterSpec::BinaryWriterSpec(
    Stream* json_stream,
    WriteBinarySpecStreamFactory module_stream_factory,
    std::string_view source_filename,
    std::string_view module_filename_noext,
    const WriteBinaryOptions& options)
    : json_stream_(json_stream),
      module_stream_factory_(module_stream_factory),
      source_filename_(source_filename),
      module_filename_noext_(module_filename_noext),
      options_(options) {}